

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsValidation.cpp
# Opt level: O3

bool __thiscall
chrono::utils::ChValidation::Process
          (ChValidation *this,string *sim_filename,string *ref_filename,char delim)

{
  Data *data;
  Data *data_00;
  ulong uVar1;
  double dVar2;
  pointer pvVar3;
  pointer pvVar4;
  double *pdVar5;
  size_t sVar6;
  double *pdVar7;
  void *pvVar8;
  ulong *puVar9;
  size_t sVar10;
  long lVar11;
  char *pcVar12;
  ostream *poVar13;
  ulong uVar14;
  size_t __s;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM3 [16];
  
  data = &this->m_sim_data;
  sVar6 = ReadDataFile(sim_filename,delim,&this->m_sim_headers,data);
  this->m_num_rows = sVar6;
  data_00 = &this->m_ref_data;
  this->m_num_cols =
       (long)(this->m_sim_headers).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->m_sim_headers).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  sVar6 = ReadDataFile(ref_filename,delim,&this->m_ref_headers,data_00);
  if ((this->m_L2_norms)._M_size != 0) {
    operator_delete((this->m_L2_norms)._M_data);
    (this->m_L2_norms)._M_size = 0;
    pdVar7 = (double *)::operator_new(0);
    (this->m_L2_norms)._M_data = pdVar7;
  }
  if ((this->m_RMS_norms)._M_size != 0) {
    operator_delete((this->m_RMS_norms)._M_data);
    (this->m_RMS_norms)._M_size = 0;
    pdVar7 = (double *)::operator_new(0);
    (this->m_RMS_norms)._M_data = pdVar7;
  }
  if ((this->m_INF_norms)._M_size != 0) {
    operator_delete((this->m_INF_norms)._M_data);
    (this->m_INF_norms)._M_size = 0;
    pdVar7 = (double *)::operator_new(0);
    (this->m_INF_norms)._M_data = pdVar7;
  }
  if (this->m_num_cols ==
      (long)(this->m_ref_headers).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->m_ref_headers).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    if (this->m_num_rows == sVar6) {
      pvVar3 = (data->
               super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      sVar6 = pvVar3->_M_size;
      pvVar4 = (data_00->
               super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pvVar8 = ::operator_new(sVar6 * 8);
      auVar16 = ZEXT816(0) << 0x40;
      if (sVar6 != 0) {
        pdVar7 = pvVar3->_M_data;
        pdVar5 = pvVar4->_M_data;
        sVar10 = 0;
        do {
          *(double *)((long)pvVar8 + sVar10 * 8) = pdVar7[sVar10] - pdVar5[sVar10];
          sVar10 = sVar10 + 1;
        } while (sVar6 != sVar10);
        dVar15 = *(double *)((long)pvVar8 + sVar6 * 8 + -8);
        dVar15 = dVar15 * dVar15;
        for (; auVar16._8_8_ = 0, auVar16._0_8_ = dVar15, sVar6 != 1; sVar6 = sVar6 - 1) {
          dVar2 = *(double *)((long)pvVar8 + sVar6 * 8 + -0x10);
          dVar15 = dVar15 + dVar2 * dVar2;
        }
      }
      if (auVar16._0_8_ < 0.0) {
        dVar15 = sqrt(auVar16._0_8_);
      }
      else {
        auVar16 = vsqrtsd_avx(auVar16,auVar16);
        dVar15 = auVar16._0_8_;
      }
      operator_delete(pvVar8);
      if (dVar15 <= 1e-10) {
        sVar10 = this->m_num_cols;
        pdVar7 = (this->m_L2_norms)._M_data;
        sVar6 = sVar10 - 1;
        if ((this->m_L2_norms)._M_size != sVar6) {
          operator_delete(pdVar7);
          (this->m_L2_norms)._M_size = sVar6;
          pdVar7 = (double *)::operator_new(sVar6 * 8);
          (this->m_L2_norms)._M_data = pdVar7;
        }
        if (sVar6 != 0) {
          memset(pdVar7,0,sVar10 * 8 - 8);
        }
        sVar10 = this->m_num_cols;
        pdVar7 = (this->m_RMS_norms)._M_data;
        sVar6 = sVar10 - 1;
        if ((this->m_RMS_norms)._M_size != sVar6) {
          operator_delete(pdVar7);
          (this->m_RMS_norms)._M_size = sVar6;
          pdVar7 = (double *)::operator_new(sVar6 * 8);
          (this->m_RMS_norms)._M_data = pdVar7;
        }
        if (sVar6 != 0) {
          memset(pdVar7,0,sVar10 * 8 - 8);
        }
        sVar10 = this->m_num_cols;
        pdVar7 = (this->m_INF_norms)._M_data;
        sVar6 = sVar10 - 1;
        if ((this->m_INF_norms)._M_size != sVar6) {
          operator_delete(pdVar7);
          (this->m_INF_norms)._M_size = sVar6;
          pdVar7 = (double *)::operator_new(sVar6 * 8);
          (this->m_INF_norms)._M_data = pdVar7;
        }
        if (sVar6 != 0) {
          memset(pdVar7,0,sVar10 * 8 - 8);
        }
        if (this->m_num_cols == 1) {
          return true;
        }
        uVar14 = 0;
        do {
          uVar1 = uVar14 + 1;
          pvVar3 = (data->
                   super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          sVar6 = pvVar3[uVar1]._M_size;
          pvVar4 = (data_00->
                   super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pvVar8 = ::operator_new(sVar6 * 8);
          auVar17 = ZEXT816(0) << 0x40;
          if (sVar6 != 0) {
            pdVar7 = pvVar4[uVar1]._M_data;
            sVar10 = 0;
            pdVar5 = pvVar3[uVar1]._M_data;
            do {
              *(double *)((long)pvVar8 + sVar10 * 8) = pdVar5[sVar10] - pdVar7[sVar10];
              sVar10 = sVar10 + 1;
            } while (sVar6 != sVar10);
            dVar15 = *(double *)((long)pvVar8 + sVar6 * 8 + -8);
            dVar15 = dVar15 * dVar15;
            for (; auVar17._8_8_ = 0, auVar17._0_8_ = dVar15, sVar6 != 1; sVar6 = sVar6 - 1) {
              dVar2 = *(double *)((long)pvVar8 + sVar6 * 8 + -0x10);
              dVar15 = dVar15 + dVar2 * dVar2;
            }
          }
          if (auVar17._0_8_ < 0.0) {
            dVar15 = sqrt(auVar17._0_8_);
          }
          else {
            auVar16 = vsqrtsd_avx(auVar17,auVar17);
            dVar15 = auVar16._0_8_;
          }
          (this->m_L2_norms)._M_data[uVar14] = dVar15;
          operator_delete(pvVar8);
          pvVar3 = (this->m_sim_data).
                   super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar4 = (this->m_ref_data).
                   super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          sVar6 = pvVar3[uVar1]._M_size;
          pvVar8 = ::operator_new(sVar6 * 8);
          if (sVar6 == 0) {
            auVar18 = SUB6416(ZEXT864(0),0) << 0x40;
          }
          else {
            pdVar7 = pvVar4[uVar1]._M_data;
            sVar10 = 0;
            pdVar5 = pvVar3[uVar1]._M_data;
            do {
              *(double *)((long)pvVar8 + sVar10 * 8) = pdVar5[sVar10] - pdVar7[sVar10];
              sVar10 = sVar10 + 1;
            } while (sVar6 != sVar10);
            dVar15 = *(double *)((long)pvVar8 + sVar6 * 8 + -8);
            dVar15 = dVar15 * dVar15;
            for (sVar10 = sVar6; auVar18._8_8_ = 0, auVar18._0_8_ = dVar15, sVar10 != 1;
                sVar10 = sVar10 - 1) {
              dVar2 = *(double *)((long)pvVar8 + sVar10 * 8 + -0x10);
              dVar15 = dVar15 + dVar2 * dVar2;
            }
          }
          auVar16 = vcvtusi2sd_avx512f(in_XMM3,sVar6);
          auVar19._0_8_ = auVar18._0_8_ / auVar16._0_8_;
          auVar19._8_8_ = auVar18._8_8_;
          if (auVar19._0_8_ < 0.0) {
            dVar15 = sqrt(auVar19._0_8_);
          }
          else {
            auVar16 = vsqrtsd_avx(auVar19,auVar19);
            dVar15 = auVar16._0_8_;
          }
          (this->m_RMS_norms)._M_data[uVar14] = dVar15;
          operator_delete(pvVar8);
          pvVar3 = (this->m_sim_data).
                   super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar4 = (this->m_ref_data).
                   super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          sVar6 = pvVar3[uVar1]._M_size;
          puVar9 = (ulong *)::operator_new(sVar6 * 8);
          if (sVar6 == 0) {
            dVar15 = 0.0;
          }
          else {
            auVar22._8_8_ = 0x7fffffffffffffff;
            auVar22._0_8_ = 0x7fffffffffffffff;
            pdVar7 = pvVar4[uVar1]._M_data;
            sVar10 = 0;
            pdVar5 = pvVar3[uVar1]._M_data;
            do {
              puVar9[sVar10] = (ulong)(pdVar5[sVar10] - pdVar7[sVar10]);
              sVar10 = sVar10 + 1;
            } while (sVar6 != sVar10);
            auVar20._8_8_ = 0;
            auVar20._0_8_ = *puVar9;
            auVar16 = vandpd_avx(auVar20,auVar22);
            dVar15 = auVar16._0_8_;
            if (sVar6 != 1) {
              sVar10 = 1;
              do {
                auVar21._8_8_ = 0;
                auVar21._0_8_ = puVar9[sVar10];
                sVar10 = sVar10 + 1;
                auVar17 = vandpd_avx(auVar21,auVar22);
                auVar16 = vmaxsd_avx(auVar17,auVar16);
                dVar15 = auVar16._0_8_;
              } while (sVar6 != sVar10);
            }
          }
          (this->m_INF_norms)._M_data[uVar14] = dVar15;
          operator_delete(puVar9);
          uVar14 = uVar1;
        } while (uVar1 < this->m_num_cols - 1);
        return true;
      }
      poVar13 = (ostream *)&std::cout;
      pcVar12 = "ERROR: time sequences do not match.";
      lVar11 = 0x23;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ERROR: the number of rows in the two files is different:",
                 0x38);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   File ",8);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(sim_filename->_M_dataplus)._M_p,
                           sim_filename->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," has ",5);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," columns",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   File ",8);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(ref_filename->_M_dataplus)._M_p,
                           ref_filename->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," has ",5);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      lVar11 = 8;
      pcVar12 = " columns";
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ERROR: the number of columns in the two files is different:",
               0x3b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   File ",8);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(sim_filename->_M_dataplus)._M_p,
                         sim_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," has ",5);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," columns",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   File ",8);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(ref_filename->_M_dataplus)._M_p,
                         ref_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," has ",5);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    lVar11 = 8;
    pcVar12 = " columns";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar12,lVar11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  return false;
}

Assistant:

bool ChValidation::Process(const std::string& sim_filename,
                           const std::string& ref_filename,
                           char               delim)
{
  // Read the simulation results file.
  m_num_rows = ReadDataFile(sim_filename, delim, m_sim_headers, m_sim_data);
  m_num_cols = m_sim_headers.size();

  // Read the reference data file.
  size_t num_ref_rows = ReadDataFile(ref_filename, delim, m_ref_headers, m_ref_data);

  // Resize the arrays of norms to zero length
  // (needed if we return with an error below)
  m_L2_norms.resize(0);
  m_RMS_norms.resize(0);
  m_INF_norms.resize(0);

  // Perform some sanity checks.
  if (m_num_cols != m_ref_headers.size()) {
    std::cout << "ERROR: the number of columns in the two files is different:" << std::endl;
    std::cout << "   File " << sim_filename << " has " << m_num_cols << " columns" << std::endl;
    std::cout << "   File " << ref_filename << " has " << m_ref_headers.size() << " columns" << std::endl;
    return false;
  }

  if (m_num_rows != num_ref_rows) {
    std::cout << "ERROR: the number of rows in the two files is different:" << std::endl;
    std::cout << "   File " << sim_filename << " has " << m_num_rows << " columns" << std::endl;
    std::cout << "   File " << ref_filename << " has " << num_ref_rows << " columns" << std::endl;
    return false;
  }

  // Ensure that the first columns (time) are the same.
  if (L2norm(m_sim_data[0] - m_ref_data[0]) > 1e-10) {
    std::cout << "ERROR: time sequences do not match." << std::endl;
    return false;
  }

  // Resize arrays of norms.
  m_L2_norms.resize(m_num_cols - 1);
  m_RMS_norms.resize(m_num_cols - 1);
  m_INF_norms.resize(m_num_cols - 1);

  // Calculate norms of the differences.
  for (size_t col = 0; col < m_num_cols - 1; col++) {
    m_L2_norms[col] = L2norm(m_sim_data[col + 1] - m_ref_data[col + 1]);
    m_RMS_norms[col] = RMSnorm(m_sim_data[col + 1] - m_ref_data[col + 1]);
    m_INF_norms[col] = INFnorm(m_sim_data[col + 1] - m_ref_data[col + 1]);
  }

  return true;
}